

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderExecUtil::BufferIoExecutor::uploadInputBuffer
          (BufferIoExecutor *this,void **inputPtrs,int numValues)

{
  int iVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deBool dVar4;
  undefined4 extraout_var;
  void *dstBasePtr;
  TestError *this_00;
  VarType *pVVar6;
  reference pvVar7;
  reference layout_00;
  VarLayout *layout;
  VarType *varType;
  size_t inputNdx;
  void *mapPtr;
  int inputBufferSize;
  deUint32 inputStride;
  deUint32 buffer;
  Functions *gl;
  int numValues_local;
  void **inputPtrs_local;
  BufferIoExecutor *this_local;
  long lVar5;
  
  iVar1 = (*((this->super_ShaderExecutor).m_renderCtx)->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  dVar2 = glu::ObjectWrapper::operator*(&(this->m_inputBuffer).super_ObjectWrapper);
  dVar3 = getLayoutStride(&this->m_inputLayout);
  if (dVar3 * numValues != 0) {
    (**(code **)(lVar5 + 0x40))(0x90d2,dVar2);
    dstBasePtr = (void *)(**(code **)(lVar5 + 0xd00))(0x90d2,0,(long)(int)(dVar3 * numValues),2);
    dVar2 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar2,"glMapBufferRange()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                    ,0x40a);
    do {
      dVar4 = ::deGetFalse();
      if ((dVar4 != 0) || (dstBasePtr == (void *)0x0)) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"mapPtr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                   ,0x40b);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    for (varType = (VarType *)0x0;
        pVVar6 = (VarType *)
                 std::
                 vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                 ::size(&(this->super_ShaderExecutor).m_inputs), varType < pVVar6;
        varType = (VarType *)((long)&varType->m_type + 1)) {
      pvVar7 = std::
               vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
               ::operator[](&(this->super_ShaderExecutor).m_inputs,(size_type)varType);
      layout_00 = std::
                  vector<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
                  ::operator[](&this->m_inputLayout,(size_type)varType);
      copyToBuffer(&pvVar7->varType,layout_00,numValues,inputPtrs[(long)varType],dstBasePtr);
    }
    (**(code **)(lVar5 + 0x1670))(0x90d2);
    dVar2 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar2,"glUnmapBuffer()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                    ,0x41f);
  }
  return;
}

Assistant:

void BufferIoExecutor::uploadInputBuffer (const void* const* inputPtrs, int numValues)
{
	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	const deUint32			buffer			= *m_inputBuffer;
	const deUint32			inputStride		= getLayoutStride(m_inputLayout);
	const int				inputBufferSize	= inputStride*numValues;

	if (inputBufferSize == 0)
		return; // No inputs

	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, buffer);
	void* mapPtr = gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, inputBufferSize, GL_MAP_WRITE_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");
	TCU_CHECK(mapPtr);

	try
	{
		DE_ASSERT(m_inputs.size() == m_inputLayout.size());
		for (size_t inputNdx = 0; inputNdx < m_inputs.size(); ++inputNdx)
		{
			const glu::VarType&		varType		= m_inputs[inputNdx].varType;
			const VarLayout&		layout		= m_inputLayout[inputNdx];

			copyToBuffer(varType, layout, numValues, inputPtrs[inputNdx], mapPtr);
		}
	}
	catch (...)
	{
		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		throw;
	}

	gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");
}